

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse4.c
# Opt level: O2

void av1_round_shift_array_sse4_1(int32_t *arr,int size,int bit)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  __m128i round;
  undefined1 auVar12 [16];
  
  uVar11 = size >> 2;
  if (bit < 1) {
    uVar10 = 0;
    uVar9 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
      piVar1 = (int *)((long)arr + uVar10);
      iVar7 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)arr + uVar10);
      *piVar2 = *piVar1 << -bit;
      piVar2[1] = iVar7;
      piVar2[2] = iVar4;
      piVar2[3] = iVar5;
    }
  }
  else {
    bVar3 = (char)bit - 1U & 0x1f;
    iVar7 = 1 << bVar3;
    uVar8 = 0 << bVar3;
    uVar9 = (ulong)uVar8;
    if ((int)uVar11 < 1) {
      uVar11 = uVar8;
    }
    auVar12 = ZEXT416((uint)bit);
    for (; (ulong)uVar11 * 0x10 != uVar9; uVar9 = uVar9 + 0x10) {
      piVar1 = (int *)((long)arr + uVar9);
      iVar4 = piVar1[1];
      iVar5 = piVar1[2];
      iVar6 = piVar1[3];
      piVar2 = (int *)((long)arr + uVar9);
      *piVar2 = *piVar1 + iVar7 >> auVar12;
      piVar2[1] = iVar4 + iVar7 >> auVar12;
      piVar2[2] = iVar5 + iVar7 >> auVar12;
      piVar2[3] = iVar6 + iVar7 >> auVar12;
    }
  }
  return;
}

Assistant:

void av1_round_shift_array_sse4_1(int32_t *arr, int size, int bit) {
  __m128i *const vec = (__m128i *)arr;
  const int vec_size = size >> 2;
  av1_round_shift_array_32_sse4_1(vec, vec, vec_size, bit);
}